

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O2

SDKResult __thiscall
tonk::SDKConnection::Send(SDKConnection *this,void *data,uint64_t bytes,uint32_t channel)

{
  SDKResult SVar1;
  
  SVar1.Result = tonk_send(this->MyConnection,data,bytes,channel);
  return (SDKResult)SVar1.Result;
}

Assistant:

SDKResult SDKConnection::Send(
    const void*               data, ///< [in] Pointer to message data
    uint64_t                 bytes, ///< [in] Message bytes
    uint32_t               channel  ///< [in] Channel to attach to message
)
{
    SDKResult sdkResult = tonk_send(
        MyConnection,
        data,
        bytes,
        channel);
    return sdkResult;
}